

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O2

chunk_conflict * mtntop_gen(player *p,wchar_t height,wchar_t width,char **p_error)

{
  loc to_avoid;
  ulong uVar1;
  wchar_t wVar2;
  _Bool _Var3;
  int16_t iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  wchar_t wVar7;
  uint32_t uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  chunk *c;
  ulong extraout_RAX;
  loc lVar12;
  loc lVar13;
  feature *pfVar14;
  loc_conflict lVar15;
  loc_conflict lVar16;
  wchar_t A;
  wchar_t *pwVar17;
  ulong uVar18;
  int iVar19;
  wchar_t wVar20;
  uint uVar21;
  ulong uVar22;
  loc grid;
  int iVar23;
  player *ppVar24;
  loc_conflict grid1;
  long lVar25;
  loc lVar26;
  ulong local_78;
  uint32_t local_6c;
  ulong local_58;
  ulong local_50;
  
  c = (chunk *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  c->depth = (int)p->depth;
  c->place = (int)p->place;
  lVar25 = 0;
  ppVar24 = p;
  for (uVar22 = 0; (long)uVar22 < (long)c->height; uVar22 = uVar22 + 1) {
    for (ppVar24 = (player *)0x0; (long)ppVar24 < (long)c->width;
        ppVar24 = (player *)((long)&ppVar24->race + 1)) {
      square_set_feat((chunk_conflict *)c,(loc)((long)ppVar24->recall + lVar25 + -0x32),FEAT_VOID);
    }
    lVar25 = lVar25 + 0x100000000;
  }
  set_num_vaults((chunk_conflict *)c);
  make_edges((chunk_conflict *)c,false,false);
  _Var3 = false;
  local_78 = extraout_RAX;
  local_58 = extraout_RAX;
  local_50 = extraout_RAX;
  while (_Var3 == false) {
    uVar5 = Rand_div(6);
    local_58 = (ulong)(uVar5 + 4);
    uVar6 = Rand_div(5);
    uVar22 = (ulong)(uVar6 + 4);
    uVar18 = (long)c->height / 2;
    local_78 = uVar18 & 0xffffffff;
    uVar1 = (long)c->width / 2;
    local_50 = uVar1 & 0xffffffff;
    iVar19 = (int)uVar18;
    iVar10 = (int)uVar1;
    _Var3 = generate_starburst_room
                      (c,iVar19 - (uVar6 + 4),iVar10 - (uVar5 + 4),uVar6 + iVar19 + L'\x04',
                       iVar10 + uVar5 + L'\x04',false,FEAT_ROAD,false);
  }
  lVar26 = (loc)(local_50 & 0xffffffff | local_78 << 0x20);
  square_set_feat((chunk_conflict *)c,lVar26,FEAT_GRANITE);
  square_mark((chunk_conflict *)c,lVar26);
  for (lVar25 = 0; lVar25 != 8; lVar25 = lVar25 + 1) {
    lVar13 = ddgrid[lVar25];
    lVar12 = (loc)loc_sum((loc_conflict)lVar26,(loc_conflict)lVar13);
    square_set_feat((chunk_conflict *)c,lVar12,FEAT_GRANITE);
    lVar13 = (loc)loc_sum((loc_conflict)lVar26,(loc_conflict)lVar13);
    square_mark((chunk_conflict *)c,lVar13);
  }
  wVar7 = (int)local_78 + (int)uVar22;
  iVar19 = (int)local_50;
  iVar10 = (int)local_58;
  uVar5 = 0;
  A = (int)local_78 - (int)uVar22;
  for (wVar20 = A; wVar2 = iVar19 - iVar10, wVar20 < wVar7; wVar20 = wVar20 + L'\x01') {
    for (; ppVar24 = (player *)(ulong)(uint)wVar2, wVar2 < iVar19 + iVar10; wVar2 = wVar2 + L'\x01')
    {
      lVar26.y = wVar20;
      lVar26.x = wVar2;
      pfVar14 = square_feat((chunk_conflict *)c,lVar26);
      uVar5 = uVar5 + (pfVar14->fidx == FEAT_ROAD);
    }
  }
  uVar6 = Rand_div(uVar5);
  uVar8 = Rand_div(2);
  if (uVar8 == 0) {
    wVar20 = rand_range(A,wVar7);
    pfVar14 = square_feat((chunk_conflict *)c,
                          (loc)((ulong)ppVar24 & 0xffffffff | (ulong)(uint)wVar20 << 0x20));
    if (pfVar14->fidx != FEAT_VOID) {
      uVar8 = Rand_div(2);
      iVar23 = 0;
      uVar21 = -(uint)(uVar8 != 0) | 1;
      iVar9 = (iVar10 + 1) * uVar21;
      do {
        if (iVar9 == iVar23) {
          lVar13.y = wVar20;
          lVar13.x = iVar9 + iVar19;
          break;
        }
        lVar13.y = wVar20;
        lVar13.x = iVar19 + iVar23;
        pfVar14 = square_feat((chunk_conflict *)c,lVar13);
        iVar23 = iVar23 + uVar21;
      } while (pfVar14->fidx != FEAT_VOID);
      square_set_feat((chunk_conflict *)c,lVar13,FEAT_MORE);
    }
  }
  for (; wVar20 = iVar19 - iVar10, A < wVar7; A = A + L'\x01') {
    for (; wVar20 < iVar19 + iVar10; wVar20 = wVar20 + L'\x01') {
      lVar12.y = A;
      lVar12.x = wVar20;
      pfVar14 = square_feat((chunk_conflict *)c,lVar12);
      if (((pfVar14->fidx != FEAT_VOID) &&
          (pfVar14 = square_feat((chunk_conflict *)c,lVar12), pfVar14->fidx != FEAT_GRANITE)) &&
         (pfVar14 = square_feat((chunk_conflict *)c,lVar12), pfVar14->fidx != FEAT_MORE)) {
        pfVar14 = square_feat((chunk_conflict *)c,lVar12);
        if ((pfVar14->fidx == FEAT_ROAD) && (uVar5 = uVar5 - 1, uVar5 == uVar6)) {
          player_place((chunk_conflict2 *)c,p,lVar12);
          square_mark((chunk_conflict *)c,lVar12);
          uVar5 = uVar6;
        }
        else {
          uVar8 = Rand_div(5);
          if (uVar8 == 0) {
            pwVar17 = &FEAT_GRANITE;
          }
          else {
            uVar8 = Rand_div(8);
            if (uVar8 == 0) {
              pwVar17 = &FEAT_PASS_RUBBLE;
            }
            else {
              uVar8 = Rand_div(0x14);
              if (uVar8 != 0) goto LAB_001586a5;
              pwVar17 = &FEAT_TREE2;
            }
          }
          square_set_feat((chunk_conflict *)c,lVar12,*pwVar17);
        }
      }
LAB_001586a5:
    }
  }
  local_6c = Rand_div(4);
  for (iVar10 = 0; iVar10 != 10; iVar10 = iVar10 + 1) {
    uVar5 = Rand_div(6);
    iVar19 = uVar5 + 4;
    uVar6 = Rand_div(5);
    iVar9 = uVar6 + 4;
    iVar23 = rand_range(iVar9,(c->height - uVar6) + -5);
    iVar11 = rand_range(iVar19,(c->width - uVar5) + -5);
    lVar15 = loc(-4 - uVar5,-4 - uVar6);
    grid1.y = iVar23;
    grid1.x = iVar11;
    lVar15 = loc_sum(grid1,lVar15);
    lVar16 = loc(iVar19,iVar9);
    lVar16 = loc_sum(grid1,lVar16);
    _Var3 = check_clearing_space((chunk_conflict *)c,lVar15,lVar16);
    if (_Var3) {
      wVar20 = iVar23 - iVar9;
      _Var3 = generate_starburst_room
                        (c,wVar20,iVar11 - iVar19,iVar23 + iVar9,iVar11 + iVar19,false,FEAT_ROAD,
                         false);
      if (_Var3) {
        for (; wVar7 = iVar11 - iVar19, wVar20 < iVar23 + iVar9; wVar20 = wVar20 + L'\x01') {
          for (; wVar7 < iVar11 + iVar19; wVar7 = wVar7 + L'\x01') {
            grid.y = wVar20;
            grid.x = wVar7;
            pfVar14 = square_feat((chunk_conflict *)c,grid);
            if (pfVar14->fidx != FEAT_VOID) {
              uVar5 = Rand_div(5);
              pwVar17 = &FEAT_GRANITE;
              if (uVar5 != 0) {
                uVar5 = Rand_div(8);
                pwVar17 = &FEAT_PASS_RUBBLE;
                if (uVar5 != 0) {
                  uVar5 = Rand_div(0x14);
                  pwVar17 = &FEAT_TREE2;
                  if (uVar5 != 0) goto LAB_00158842;
                }
              }
              square_set_feat((chunk_conflict *)c,grid,*pwVar17);
            }
LAB_00158842:
          }
        }
        local_6c = local_6c - 1;
        if (local_6c == 0) break;
      }
    }
  }
  lVar25 = 0;
  for (uVar22 = 0; (long)uVar22 < (long)c->height; uVar22 = uVar22 + 1) {
    for (uVar18 = 0; (long)uVar18 < (long)c->width; uVar18 = uVar18 + 1) {
      square_unmark((chunk_conflict *)c,(loc)(lVar25 + uVar18));
      if (((uVar18 == 0 || uVar22 == 0) || (uVar22 == (uint)(c->height + L'\xffffffff'))) ||
         (uVar18 == (uint)(c->width + L'\xffffffff'))) {
        square_set_feat((chunk_conflict *)c,(loc)(lVar25 + uVar18),FEAT_PERM);
      }
    }
    lVar25 = lVar25 + 0x100000000;
  }
  wVar20 = c->depth;
  get_mon_num(wVar20,wVar20);
  for (; L'\0' < wVar20; wVar20 = wVar20 + L'\xffffffff') {
    to_avoid.x = (player->grid).x;
    to_avoid.y = (player->grid).y;
    pick_and_place_distant_monster(c,to_avoid,L'\n',true,c->depth);
  }
  iVar4 = Rand_normal((uint)z_info->both_item_av,3);
  alloc_objects((chunk_conflict *)c,L'\x03',L'\x03',(int)iVar4,c->depth,'\x01');
  return (chunk_conflict *)c;
}

Assistant:

struct chunk *mtntop_gen(struct player *p, int height, int width,
						 const char **p_error)
{
	struct loc grid, top;
	int i, j, k;
	int plats, a, b;
	int spot, floors = 0;
	bool placed = false;

	/* Make the level */
	struct chunk *c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = p->place;

	/* Start with void */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			/* Create void */
			square_set_feat(c, grid, FEAT_VOID);
		}
	}

	/* Set the number of wilderness vaults */
	set_num_vaults(c);

	/* Make place boundaries */
	make_edges(c, false, false);

	/* Make the main mountaintop */
	while (!placed) {
		a = randint0(6) + 4;
		b = randint0(5) + 4;
		top.y = c->height / 2;
		top.x = c->width / 2;
		placed = generate_starburst_room(c, top.y - b, top.x - a, top.y + b,
										 top.x + a, false, FEAT_ROAD, false);
	}

	/* Summit */
	square_set_feat(c, top, FEAT_GRANITE);
	square_mark(c, top);
	for (i = 0; i < 8; i++) {
		square_set_feat(c, loc_sum(top, ddgrid[i]), FEAT_GRANITE);
		square_mark(c, loc_sum(top, ddgrid[i]));
	}

	/* Count the floors */
	for (grid.y = top.y - b; grid.y < top.y + b; grid.y++) {
		for (grid.x = top.x - a; grid.x < top.x + a; grid.x++) {
			if (square_feat(c, grid)->fidx == FEAT_ROAD) {
				floors++;
			}
		}
	}

	/* Choose the player place */
	spot = randint0(floors);

	/* Can we get down? */
	if (one_in_(2)) {
		grid.y = rand_range(top.y - b, top.y + b);
		if (square_feat(c, grid)->fidx != FEAT_VOID) {
			i = one_in_(2) ? 1 : -1;
			for (grid.x = top.x; grid.x != (top.x + i * (a + 1)); grid.x += i) {
				if (square_feat(c, grid)->fidx == FEAT_VOID) break;
			}
			square_set_feat(c, grid, FEAT_MORE);
		}
	}

	/* Adjust the terrain, place the player */
	for (grid.y = top.y - b; grid.y < top.y + b; grid.y++) {
		for (grid.x = top.x - a; grid.x < top.x + a; grid.x++) {
			/* Only change generated stuff */
			if (square_feat(c, grid)->fidx == FEAT_VOID)
				continue;

			/* Leave rock */
			if (square_feat(c, grid)->fidx == FEAT_GRANITE)
				continue;

			/* Leave stair */
			if (square_feat(c, grid)->fidx == FEAT_MORE)
				continue;

			/* Place the player? */
			if (square_feat(c, grid)->fidx == FEAT_ROAD) {
				floors--;
				if (floors == spot) {
					player_place(c, p, grid);
					square_mark(c, grid);
					continue;
				}
			}

			/* Place some rock */
			if (one_in_(5)) {
				square_set_feat(c, grid, FEAT_GRANITE);
				continue;
			}

			/* rubble */
			if (one_in_(8)) {
				square_set_feat(c, grid, FEAT_PASS_RUBBLE);
				continue;
			}

			/* and the odd tree */
			if (one_in_(20)) {
				square_set_feat(c, grid, FEAT_TREE2);
				continue;
			}
		}
	}

	/* Make a few "plateaux" */
	plats = randint0(4);

	/* Try fairly hard */
	for (j = 0; j < 10; j++) {
		/* Try for a plateau */
		a = randint0(6) + 4;
		b = randint0(5) + 4;
		top.y = rand_range(b, c->height - 1 - b);
		top.x = rand_range(a, c->width - 1 - a);
		if (!check_clearing_space(c, loc_sum(top, loc(-a, -b)),
				loc_sum(top, loc(a, b)))
				|| !generate_starburst_room(c, top.y - b,
				top.x - a, top.y + b, top.x + a, false,
				FEAT_ROAD, false)) continue;

		/* Success */
		plats--;

		/* Adjust the terrain a bit */
		for (grid.y = top.y - b; grid.y < top.y + b; grid.y++) {
			for (grid.x = top.x - a; grid.x < top.x + a; grid.x++) {
				/* Only change generated stuff */
				if (square_feat(c, grid)->fidx == FEAT_VOID)
					continue;

				/* Place some rock */
				if (one_in_(5)) {
					square_set_feat(c, grid, FEAT_GRANITE);
					continue;
				}

				/* rubble */
				if (one_in_(8)) {
					square_set_feat(c, grid, FEAT_PASS_RUBBLE);
					continue;
				}

				/* and the odd tree */
				if (one_in_(20)) {
					square_set_feat(c, grid, FEAT_TREE2);
					continue;
				}
			}
		}

		/* Done ? */
		if (!plats)
			break;
	}


	/* Unmark squares */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			square_unmark(c, grid);

			/* Paranoia - remake the dungeon walls */
			if ((grid.y == 0) || (grid.x == 0) ||
				(grid.y == c->height - 1) || (grid.x == c->width - 1)) {
				square_set_feat(c, grid, FEAT_PERM);
			}
		}
	}

	/* Basic "amount" */
	k = c->depth;

	/* Build the monster probability table. */
	(void) get_mon_num(c->depth, c->depth);

	/* Put some monsters in the dungeon */
	for (j = k; j > 0; j--) {
		(void) pick_and_place_distant_monster(c, player->grid, 10, true,
											  c->depth);
	}


	/* Put some objects in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT, Rand_normal(z_info->both_item_av, 3),
				 c->depth, ORIGIN_FLOOR);


	return c;
}